

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bean_ptr_impl.hpp
# Opt level: O3

void __thiscall hiberlite::real_bean<A>::save(real_bean<A> *this)

{
  int *piVar1;
  A *bean;
  bean_key local_28;
  
  if ((this->forgotten == false) && (bean = this->obj, bean != (A *)0x0)) {
    local_28.id = (this->key).id;
    local_28.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001d3578;
    local_28.con.res = (this->key).con.res;
    if (local_28.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      (local_28.con.res)->refCount = (local_28.con.res)->refCount + 1;
    }
    Database::dbUpdate<A>(&local_28,bean);
    local_28.con._vptr_shared_res = (_func_int **)&PTR__shared_res_001d3578;
    if (local_28.con.res != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
      piVar1 = &(local_28.con.res)->refCount;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        (*(local_28.con.res)->_vptr_shared_cnt_obj_pair[1])();
      }
    }
  }
  return;
}

Assistant:

void real_bean<C>::save() {
	if(forgotten)
		return;
	if(!obj)
		return;
	Database::dbUpdate(key, *obj);
}